

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meter.cc
# Opt level: O2

double __thiscall fasttext::Meter::precisionAtRecall(Meter *this,int32_t labelId,double recallQuery)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [64];
  _Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> local_20;
  
  precisionRecallCurve
            ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
             &local_20,this,labelId);
  auVar2 = ZEXT864(0) << 0x40;
  for (; local_20._M_impl.super__Vector_impl_data._M_start !=
         local_20._M_impl.super__Vector_impl_data._M_finish;
      local_20._M_impl.super__Vector_impl_data._M_start =
           local_20._M_impl.super__Vector_impl_data._M_start + 1) {
    if (recallQuery <= (local_20._M_impl.super__Vector_impl_data._M_start)->second) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (local_20._M_impl.super__Vector_impl_data._M_start)->first;
      auVar1 = vmaxsd_avx(auVar1,auVar2._0_16_);
      auVar2 = ZEXT1664(auVar1);
    }
  }
  std::_Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
  ~_Vector_base(&local_20);
  return auVar2._0_8_;
}

Assistant:

double Meter::precisionAtRecall(int32_t labelId, double recallQuery) const {
  const auto& precisionRecall = precisionRecallCurve(labelId);
  double bestPrecision = 0.0;
  std::for_each(
      precisionRecall.begin(),
      precisionRecall.end(),
      [&bestPrecision, recallQuery](const std::pair<double, double>& element) {
        if (element.second >= recallQuery) {
          bestPrecision = std::max(bestPrecision, element.first);
        };
      });
  return bestPrecision;
}